

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

aiVector3D __thiscall Assimp::D3MF::XmlSerializer::ReadVertex(XmlSerializer *this)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float fVar3;
  float fVar4;
  float fVar5;
  aiVector3D aVar6;
  
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::x_abi_cxx11_);
  fVar3 = 0.0;
  fVar4 = 0.0;
  if ((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) {
    dVar1 = atof((char *)CONCAT44(extraout_var,iVar2));
    fVar3 = (float)dVar1;
  }
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::y_abi_cxx11_);
  if ((char *)CONCAT44(extraout_var_00,iVar2) != (char *)0x0) {
    dVar1 = atof((char *)CONCAT44(extraout_var_00,iVar2));
    fVar4 = (float)dVar1;
  }
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::z_abi_cxx11_);
  if ((char *)CONCAT44(extraout_var_01,iVar2) == (char *)0x0) {
    fVar5 = 0.0;
  }
  else {
    dVar1 = atof((char *)CONCAT44(extraout_var_01,iVar2));
    fVar5 = (float)dVar1;
  }
  aVar6.y = fVar4;
  aVar6.x = fVar3;
  aVar6.z = fVar5;
  return aVar6;
}

Assistant:

aiVector3D ReadVertex() {
        aiVector3D vertex;

        vertex.x = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::x.c_str()), nullptr);
        vertex.y = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::y.c_str()), nullptr);
        vertex.z = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::z.c_str()), nullptr);

        return vertex;
    }